

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O0

void __thiscall flatbuffers::StructDef::StructDef(StructDef *this)

{
  StructDef *this_local;
  
  Definition::Definition(&this->super_Definition);
  SymbolTable<flatbuffers::FieldDef>::SymbolTable(&this->fields);
  this->fixed = false;
  this->predecl = true;
  this->sortbysize = true;
  this->has_key = false;
  this->minalign = 1;
  this->bytesize = 0;
  std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>::
  unique_ptr<std::default_delete<std::__cxx11::string>,void>
            ((unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>> *)
             &this->original_location);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&this->reserved_ids);
  return;
}

Assistant:

StructDef()
      : fixed(false),
        predecl(true),
        sortbysize(true),
        has_key(false),
        minalign(1),
        bytesize(0) {}